

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actions.cpp
# Opt level: O2

void __thiscall Actions::emplace(Actions *this,ActionType type,int target_id,Vec2 pos)

{
  value_type local_10;
  
  local_10.actionType = type;
  local_10.target_id = target_id;
  local_10.pos = pos;
  std::vector<Action,_std::allocator<Action>_>::push_back(&this->actions,&local_10);
  return;
}

Assistant:

void Actions::emplace(ActionType type, int target_id, Vec2 pos)
{
    Action act(type);
    act.target_id = target_id;
    act.pos = pos;
    actions.push_back(act);
}